

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_band(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  int iVar1;
  TValue *pTVar2;
  lua_Integer ib;
  lua_Integer ic;
  
  if (rb->tt_ == 0x13) {
    ib = (rb->value_).i;
  }
  else {
    iVar1 = luaV_tointegerns(rb,&ib,F2Ieq);
    if (iVar1 == 0) goto LAB_0012e2f3;
  }
  pTVar2 = rc;
  if (rc->tt_ != 0x13) {
    iVar1 = luaV_tointegerns(rc,&ic,F2Ieq);
    pTVar2 = (TValue *)&ic;
    if (iVar1 == 0) {
LAB_0012e2f3:
      luaT_trybinTM(L,rb,rc,ra,TM_BAND);
      return;
    }
  }
  (ra->value_).i = (pTVar2->value_).i & ib;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_band(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, intop(&, ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_BAND);
  }
}